

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O0

void ON_SortUINT64Array(sort_algorithm sort_algorithm,ON__UINT64 *a,size_t nel)

{
  size_t nel_local;
  ON__UINT64 *a_local;
  sort_algorithm sort_algorithm_local;
  
  if (sort_algorithm == heap_sort) {
    ON_hsort_uint64(a,nel);
  }
  else {
    ON_qsort_uint64(a,nel);
  }
  return;
}

Assistant:

void ON_SortUINT64Array(
        ON::sort_algorithm sort_algorithm,
        ON__UINT64* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_uint64(a,nel);
  else
    ON_qsort_uint64(a,nel);
}